

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScenePrivate::leaveModal(QGraphicsScenePrivate *this,QGraphicsItem *panel)

{
  bool bVar1;
  QGraphicsScenePrivate *this_00;
  const_iterator cVar2;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem **item_1;
  QList<QGraphicsItem_*> *__range1_1;
  QGraphicsItem **item;
  QList<QGraphicsItem_*> *__range1;
  QGraphicsScene *q;
  QGraphicsSceneHoverEvent hoverEvent;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QList<QGraphicsItem_*> items__1;
  QEvent e;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items_;
  QSet<QGraphicsItem_*> blockedPanels;
  QGraphicsItem **in_stack_ffffffffffffff08;
  QPointF *pos;
  QGraphicsItem **in_stack_ffffffffffffff18;
  Type type;
  QGraphicsItem **in_stack_ffffffffffffff20;
  SortOrder order;
  QGraphicsSceneHoverEvent *this_01;
  QEvent *in_stack_ffffffffffffff28;
  QGraphicsItem *item_00;
  QGraphicsScenePrivate *blockingPanel;
  QGraphicsItem *in_stack_ffffffffffffff48;
  const_iterator local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  hoverEvent_00;
  QGraphicsScenePrivate *this_02;
  const_iterator local_38;
  QGraphicsItem local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  blockingPanel = in_RDI;
  this_00 = (QGraphicsScenePrivate *)q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QGraphicsItem_*>::QSet((QSet<QGraphicsItem_*> *)0x9c47a9);
  local_30._vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d_ptr.d = (QGraphicsItemPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::items
            ((QGraphicsScene *)in_stack_ffffffffffffff28,
             (SortOrder)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  item_00 = &local_30;
  local_38.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
  cVar2 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
  while (bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_38,cVar2), bVar1) {
    in_stack_ffffffffffffff28 =
         (QEvent *)QList<QGraphicsItem_*>::const_iterator::operator*(&local_38);
    bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9c48a4);
    if ((bVar1) &&
       (bVar1 = QGraphicsItem::isBlockedByModalPanel
                          (in_stack_ffffffffffffff48,(QGraphicsItem **)blockingPanel), bVar1)) {
      QSet<QGraphicsItem_*>::insert
                ((QSet<QGraphicsItem_*> *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_38);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c48fc);
  order = (SortOrder)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  QList<QGraphicsItem*>::removeAll<QGraphicsItem*>
            ((QList<QGraphicsItem_*> *)in_RDI,in_stack_ffffffffffffff08);
  this_02 = (QGraphicsScenePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&stack0xffffffffffffff98,WindowUnblocked);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  hoverEvent_00.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::items((QGraphicsScene *)in_stack_ffffffffffffff28,order);
  this_01 = (QGraphicsSceneHoverEvent *)&local_80;
  local_88.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
  cVar2 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
  while( true ) {
    type = (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_88,cVar2);
    if (!bVar1) break;
    in_stack_ffffffffffffff18 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_88);
    bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9c4a1f);
    if (((bVar1) &&
        (bVar1 = QSet<QGraphicsItem_*>::contains
                           ((QSet<QGraphicsItem_*> *)in_RDI,in_stack_ffffffffffffff08), bVar1)) &&
       (bVar1 = QGraphicsItem::isBlockedByModalPanel
                          (in_stack_ffffffffffffff48,(QGraphicsItem **)blockingPanel), !bVar1)) {
      sendEvent(this_00,item_00,in_stack_ffffffffffffff28);
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_88);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c4a87);
  QEvent::~QEvent((QEvent *)&stack0xffffffffffffff98);
  pos = (QPointF *)&stack0xffffffffffffff48;
  QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent(this_01,type);
  QGraphicsSceneHoverEvent::setScenePos((QGraphicsSceneHoverEvent *)in_RDI,pos);
  dispatchHoverEvent(this_02,(QGraphicsSceneHoverEvent *)hoverEvent_00.d);
  QGraphicsSceneHoverEvent::~QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)0x9c4aeb);
  QSet<QGraphicsItem_*>::~QSet((QSet<QGraphicsItem_*> *)0x9c4af8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::leaveModal(QGraphicsItem *panel)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(panel && panel->isPanel());

    QSet<QGraphicsItem *> blockedPanels;
    {
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && item->isBlockedByModalPanel())
                blockedPanels.insert(item);
        }
    }

    modalPanels.removeAll(panel);

    {
        QEvent e(QEvent::WindowUnblocked);
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && blockedPanels.contains(item) && !item->isBlockedByModalPanel())
                sendEvent(item, &e);
        }
    }

    // send GraphicsSceneHoverEnter events to newly unblocked items
    QGraphicsSceneHoverEvent hoverEvent;
    hoverEvent.setScenePos(lastSceneMousePos);
    dispatchHoverEvent(&hoverEvent);
}